

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O1

void extendText(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                *result,const_iterator it)

{
  pointer *pppcVar1;
  cmGeneratorExpressionEvaluator *pcVar2;
  pointer ppcVar3;
  iterator __position;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  int iVar6;
  cmGeneratorExpressionEvaluator *local_18;
  
  ppcVar3 = (result->
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (((result->
       super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
       )._M_impl.super__Vector_impl_data._M_start != ppcVar3) &&
     (iVar6 = (*ppcVar3[-1]->_vptr_cmGeneratorExpressionEvaluator[2])(), iVar6 == 0)) {
    pcVar2 = (result->
             super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1] + 2;
    pcVar2->_vptr_cmGeneratorExpressionEvaluator =
         (_func_int **)
         ((long)pcVar2->_vptr_cmGeneratorExpressionEvaluator + (it._M_current)->Length);
    return;
  }
  local_18 = (cmGeneratorExpressionEvaluator *)operator_new(0x18);
  pp_Var4 = (_func_int **)(it._M_current)->Content;
  pp_Var5 = (_func_int **)(it._M_current)->Length;
  local_18->_vptr_cmGeneratorExpressionEvaluator =
       (_func_int **)&PTR__cmGeneratorExpressionEvaluator_006dd940;
  local_18[1]._vptr_cmGeneratorExpressionEvaluator = pp_Var4;
  local_18[2]._vptr_cmGeneratorExpressionEvaluator = pp_Var5;
  __position._M_current =
       (result->
       super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (result->
      super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
    _M_realloc_insert<cmGeneratorExpressionEvaluator*>
              ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
                *)result,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppcVar1 = &(result->
                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

static void extendText(std::vector<cmGeneratorExpressionEvaluator*> &result,
                  std::vector<cmGeneratorExpressionToken>::const_iterator it)
{
  if (!result.empty()
      && (*(result.end() - 1))->GetType()
                                  == cmGeneratorExpressionEvaluator::Text)
    {
    TextContent *textContent = static_cast<TextContent*>(*(result.end() - 1));
    textContent->Extend(it->Length);
    }
  else
    {
    TextContent *textContent = new TextContent(it->Content, it->Length);
    result.push_back(textContent);
    }
}